

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall httplib::ClientImpl::close_socket(ClientImpl *this,Socket *socket)

{
  Socket *socket_local;
  ClientImpl *this_local;
  
  if (socket->sock != -1) {
    detail::close_socket(socket->sock);
    socket->sock = -1;
  }
  return;
}

Assistant:

inline void ClientImpl::close_socket(Socket& socket) {
        // If there are requests in flight in another thread, usually closing
        // the socket will be fine and they will simply receive an error when
        // using the closed socket, but it is still a bug since rarely the OS
        // may reassign the socket id to be used for a new socket, and then
        // suddenly they will be operating on a live socket that is different
        // than the one they intended!
        assert(socket_requests_in_flight_ == 0 ||
            socket_requests_are_from_thread_ == std::this_thread::get_id());

        // It is also a bug if this happens while SSL is still active
    #ifdef CPPHTTPLIB_OPENSSL_SUPPORT
        assert(socket.ssl == nullptr);
    #endif
        if (socket.sock == INVALID_SOCKET) { return; }
        detail::close_socket(socket.sock);
        socket.sock = INVALID_SOCKET;
    }